

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::NetworkAddress> __thiscall
kj::anon_unknown_30::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  LowLevelAsyncIoProvider *params;
  bool bVar1;
  SocketAddress *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress> OVar2;
  Array<kj::(anonymous_namespace)::SocketAddress> local_110;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl> local_f8;
  Fault local_e8;
  Fault f;
  SocketAddress local_d0;
  undefined1 local_48 [8];
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  uint len_local;
  void *sockaddr_local;
  SocketNetwork *this_local;
  
  array.disposer._4_4_ = in_ECX;
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,1);
  SocketAddress::SocketAddress
            (&local_d0,(void *)CONCAT44(in_register_00000014,len),array.disposer._4_4_);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::
  add<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,&local_d0);
  this_00 = ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::operator[]
                      ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,0);
  bVar1 = SocketAddress::allowedBy(this_00,(NetworkFilter *)((long)sockaddr + 0x10));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x50b,FAILED,"array[0].allowedBy(filter)","\"address blocked by restrictPeers()\"",
               (char (*) [35])"address blocked by restrictPeers()");
    _::Debug::Fault::~Fault(&local_e8);
  }
  params = *(LowLevelAsyncIoProvider **)((long)sockaddr + 8);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::finish
            (&local_110,(ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  heap<kj::(anonymous_namespace)::NetworkAddressImpl,kj::LowLevelAsyncIoProvider&,kj::_::NetworkFilter&,kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((kj *)&local_f8,params,(NetworkFilter *)((long)sockaddr + 0x10),&local_110);
  Own<kj::NetworkAddress>::Own<kj::(anonymous_namespace)::NetworkAddressImpl,void>
            ((Own<kj::NetworkAddress> *)this,&local_f8);
  Own<kj::(anonymous_namespace)::NetworkAddressImpl>::~Own(&local_f8);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&local_110);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }